

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void q_createNativeChildrenAndSetParent(QWidget *parentWidget)

{
  bool bVar1;
  QWidget *this;
  qsizetype qVar2;
  QWidget *this_00;
  WId WVar3;
  QWindow *pQVar4;
  long in_FS_OFFSET;
  QWidget *childWidget;
  int i;
  QObjectList children;
  QList<QObject_*> *in_stack_ffffffffffffffa8;
  QWidget *in_stack_ffffffffffffffb0;
  QWidget *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  QList<QObject_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QObject::children((QObject *)0x360789);
  QList<QObject_*>::QList((QList<QObject_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  iVar5 = 0;
  while( true ) {
    this = (QWidget *)(long)iVar5;
    qVar2 = QList<QObject_*>::size(&local_20);
    if (qVar2 <= (long)this) break;
    QList<QObject_*>::at
              ((QList<QObject_*> *)in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
    bVar1 = QObject::isWidgetType((QObject *)0x3607da);
    if (bVar1) {
      QList<QObject_*>::at
                ((QList<QObject_*> *)in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8)
      ;
      this_00 = qobject_cast<QWidget_const*>((QObject *)0x3607fa);
      if (this_00 != (QWidget *)0x0) {
        bVar1 = QWidget::testAttribute
                          (in_stack_ffffffffffffffb8,
                           (WidgetAttribute)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        if (bVar1) {
          WVar3 = QWidget::internalWinId(this_00);
          if (WVar3 == 0) {
            QWidget::winId(in_stack_ffffffffffffffb8);
          }
          pQVar4 = QWidget::windowHandle(in_stack_ffffffffffffffb0);
          if (pQVar4 != (QWindow *)0x0) {
            bVar1 = QWidget::isWindow(in_stack_ffffffffffffffb0);
            if (bVar1) {
              in_stack_ffffffffffffffb8 =
                   (QWidget *)QWidget::windowHandle(in_stack_ffffffffffffffb0);
              QWidget::window(this);
              QWidget::windowHandle(in_stack_ffffffffffffffb0);
              QWindow::setTransientParent((QWindow *)in_stack_ffffffffffffffb8);
            }
            else {
              in_stack_ffffffffffffffb0 =
                   (QWidget *)QWidget::windowHandle(in_stack_ffffffffffffffb0);
              QWidget::nativeParentWidget(in_stack_ffffffffffffffb0);
              QWidget::windowHandle(in_stack_ffffffffffffffb0);
              QWindow::setParent((QWindow *)in_stack_ffffffffffffffb0);
            }
          }
        }
        else {
          q_createNativeChildrenAndSetParent((QWidget *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
        }
      }
    }
    iVar5 = iVar5 + 1;
  }
  QList<QObject_*>::~QList((QList<QObject_*> *)0x3608e9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_createNativeChildrenAndSetParent(const QWidget *parentWidget)
{
    QObjectList children = parentWidget->children();
    for (int i = 0; i < children.size(); i++) {
        if (children.at(i)->isWidgetType()) {
            const QWidget *childWidget = qobject_cast<const QWidget *>(children.at(i));
            if (childWidget) { // should not be necessary
                if (childWidget->testAttribute(Qt::WA_NativeWindow)) {
                    if (!childWidget->internalWinId())
                        childWidget->winId();
                    if (childWidget->windowHandle()) {
                        if (childWidget->isWindow()) {
                            childWidget->windowHandle()->setTransientParent(parentWidget->window()->windowHandle());
                        } else {
                            childWidget->windowHandle()->setParent(childWidget->nativeParentWidget()->windowHandle());
                        }
                    }
                } else {
                    q_createNativeChildrenAndSetParent(childWidget);
                }
            }
        }
    }

}